

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O0

int linenoiseHistorySave(char *filename)

{
  __mode_t __mask;
  FILE *__stream;
  int local_2c;
  int j;
  FILE *fp;
  mode_t old_umask;
  char *filename_local;
  
  __mask = umask(0x7f);
  __stream = fopen(filename,"w");
  umask(__mask);
  if (__stream == (FILE *)0x0) {
    filename_local._4_4_ = -1;
  }
  else {
    chmod(filename,0x180);
    for (local_2c = 0; local_2c < history_len; local_2c = local_2c + 1) {
      fprintf(__stream,"%s\n",history[local_2c]);
    }
    fclose(__stream);
    filename_local._4_4_ = 0;
  }
  return filename_local._4_4_;
}

Assistant:

int linenoiseHistorySave(const char *filename) {
    mode_t old_umask = umask(S_IXUSR|S_IRWXG|S_IRWXO);
    FILE *fp;
    int j;

    fp = fopen(filename,"w");
    umask(old_umask);
    if (fp == NULL) return -1;
    chmod(filename,S_IRUSR|S_IWUSR);
    for (j = 0; j < history_len; j++)
        fprintf(fp,"%s\n",history[j]);
    fclose(fp);
    return 0;
}